

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O2

int PHYSFS_ucs4stricmp(PHYSFS_uint32 *str1,PHYSFS_uint32 *str2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  PHYSFS_uint32 *pPVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  uint *local_50;
  PHYSFS_uint32 folded2 [3];
  PHYSFS_uint32 folded1 [3];
  
  iVar1 = 0;
  iVar7 = 0;
  iVar2 = 0;
  iVar8 = 0;
  local_50 = str2;
  do {
    if (iVar1 == iVar7) {
      uVar5 = *str1;
      bVar9 = uVar5 != 0;
      if (0x10fff < uVar5) {
        uVar5 = 0x3f;
      }
      str1 = str1 + bVar9;
      pPVar4 = folded1;
      iVar1 = PHYSFS_caseFold(uVar5,pPVar4);
      iVar7 = 1;
    }
    else {
      lVar3 = (long)iVar7;
      iVar7 = iVar7 + 1;
      pPVar4 = folded1 + lVar3;
    }
    uVar5 = *pPVar4;
    if (iVar2 == iVar8) {
      uVar6 = *local_50;
      bVar9 = uVar6 != 0;
      if (0x10fff < uVar6) {
        uVar6 = 0x3f;
      }
      local_50 = local_50 + bVar9;
      pPVar4 = folded2;
      iVar2 = PHYSFS_caseFold(uVar6,pPVar4);
      iVar8 = 1;
    }
    else {
      lVar3 = (long)iVar8;
      iVar8 = iVar8 + 1;
      pPVar4 = folded2 + lVar3;
    }
    uVar6 = *pPVar4;
    if (uVar5 < uVar6) {
      return -1;
    }
    if (uVar5 >= uVar6 && uVar5 != uVar6) {
      return 1;
    }
  } while (uVar5 != 0);
  return 0;
}

Assistant:

int PHYSFS_ucs4stricmp(const PHYSFS_uint32 *str1, const PHYSFS_uint32 *str2)
{
    UTFSTRICMP(32);
}